

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O3

void __thiscall
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::EnsureArray
          (GrowingArray<unsigned_int,_Memory::HeapAllocator> *this)

{
  size_t dstCount;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  HeapAllocator *pHVar5;
  undefined4 *puVar6;
  uint *dst;
  Type puVar7;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->buffer == (Type)0x0) {
    data.plusSize = (size_t)this->length;
    local_58 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_269cd56;
    data.filename._0_4_ = 0x62;
    pHVar5 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_58);
    uVar1 = this->length;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_0069115b;
      *puVar6 = 0;
    }
    puVar7 = (Type)Memory::HeapAllocator::AllocT<false>(pHVar5,(ulong)uVar1 << 2);
    if (puVar7 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_0069115b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    this->buffer = puVar7;
    this->count = 0;
  }
  else {
    uVar1 = this->count;
    if (uVar1 == this->length) {
      if (0x7ffffffe < uVar1) {
LAB_0069115d:
        Math::DefaultOverflowPolicy();
      }
      dstCount = (ulong)uVar1 * 2 + 2;
      local_58 = (undefined1  [8])&unsigned_int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_269cd56;
      data.filename._0_4_ = 0x6b;
      data.plusSize = dstCount;
      pHVar5 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_58);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0069115b;
        *puVar6 = 0;
      }
      dst = (uint *)Memory::HeapAllocator::AllocT<false>(pHVar5,(ulong)uVar1 * 8 + 8);
      if (dst == (uint *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_0069115b;
        *puVar6 = 0;
      }
      Memory::CopyArray<unsigned_int,unsigned_int,Memory::HeapAllocator>
                (dst,dstCount,this->buffer,(ulong)this->length);
      uVar1 = this->length;
      if ((ulong)uVar1 != 0) {
        if (0x3fffffff < uVar1) goto LAB_0069115d;
        Memory::HeapAllocator::Free(this->alloc,this->buffer,(ulong)uVar1 << 2);
      }
      this->length = (Type)dstCount;
      this->buffer = dst;
    }
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }